

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O3

void armci_exchange_address_grp(void **ptr_arr,int n,ARMCI_Group *group)

{
  comex_error("armci_exchange_address_grp not implemented",1);
  return;
}

Assistant:

void armci_exchange_address_grp(void *ptr_arr[], int n, ARMCI_Group *group)
{
    comex_error("armci_exchange_address_grp not implemented", 1);
#if 0
    MPI_Datatype mpi_datatype;

    if (sizeof(void*) == sizeof(int)) {
        mpi_datatype = MPI_INT;
    }
    else if (sizeof(void*) == sizeof(long)) {
        mpi_datatype = MPI_LONG;
    }
    else if (sizeof(void*) == sizeof(long long)) {
        mpi_datatype = MPI_LONG_LONG;
    }
    else {
        comex_error("armci_exchange_address_grp bad size", 1);
    }

    MPI_Allgather(MPI_IN_PLACE, 0, MPI_DATATYPE_NULL,
            ptr_ar, n, mpi_datatype, get_comm(group));
#endif
}